

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d64_q1a_card_battle.cpp
# Opt level: O1

int main(void)

{
  undefined1 *puVar1;
  _Rb_tree_header *p_Var2;
  bool bVar3;
  _Base_ptr p_Var4;
  istream *this;
  mapped_type *pmVar5;
  long lVar6;
  ostream *poVar7;
  int iVar8;
  iterator __position;
  int iVar9;
  bool bVar10;
  int iVar11;
  int tmp;
  int m;
  int t;
  int n;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> to_pow;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_60;
  
  iVar11 = 0;
  std::ios_base::sync_with_stdio(false);
  *(undefined8 *)(*(long *)(std::cin + -0x18) + 0x105180) = 0;
  this = (istream *)std::istream::operator>>((istream *)&std::cin,&local_64);
  std::istream::operator>>(this,&local_6c);
  p_Var2 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  if (0 < local_64) {
    do {
      std::istream::operator>>((istream *)&std::cin,&local_70);
      pmVar5 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                           *)&local_60,&local_70);
      *pmVar5 = *pmVar5 + 1;
      iVar11 = iVar11 + 1;
    } while (iVar11 < local_64);
  }
  bVar3 = 0 < local_6c;
  if (local_6c < 1) {
    iVar11 = 1;
  }
  else {
    iVar8 = 0;
    iVar11 = 0;
    do {
      std::istream::operator>>((istream *)&std::cin,&local_70);
      bVar10 = local_70 < 1;
      if (0 < local_70) {
        iVar9 = 0;
        do {
          std::istream::operator>>((istream *)&std::cin,&local_68);
          if ((local_60._M_impl.super__Rb_tree_header._M_node_count == 0) ||
             (lVar6 = std::_Rb_tree_decrement(&p_Var2->_M_header),
             __position._M_node = &p_Var2->_M_header,
             p_Var4 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent,
             *(int *)(lVar6 + 0x20) <= local_68)) {
            poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar11 + 1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
            break;
          }
          for (; (_Rb_tree_header *)p_Var4 != (_Rb_tree_header *)0x0;
              p_Var4 = (&p_Var4->_M_left)[(int)*(size_t *)(p_Var4 + 1) <= local_68]) {
            if (local_68 < (int)*(size_t *)(p_Var4 + 1)) {
              __position._M_node = p_Var4;
            }
          }
          if ((_Rb_tree_header *)__position._M_node == p_Var2) {
            __position._M_node = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
          }
          puVar1 = &__position._M_node[1].field_0x4;
          *(int *)puVar1 = *(int *)puVar1 + -1;
          if (*(int *)puVar1 == 0) {
            std::
            _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
            ::erase_abi_cxx11_((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
                                *)&local_60,__position);
          }
          iVar9 = iVar9 + 1;
          bVar10 = local_70 <= iVar9;
        } while (iVar9 < local_70);
      }
      iVar11 = iVar11 + (uint)bVar10;
      if (bVar10 == false) break;
      iVar8 = iVar8 + 1;
      bVar3 = iVar8 < local_6c;
    } while (iVar8 < local_6c);
    iVar11 = iVar11 + 1;
  }
  if (!bVar3) {
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&local_60);
  return 0;
}

Assistant:

int main() {
    ios::sync_with_stdio(false);
    cin.tie(0);

    int n, m;
    cin >> n >> m;
    map<int,int> to_pow;
    for (int i = 0; i < n; ++i) {
        // cin >> to_pow[i];
        int tmp;
        cin >> tmp;
        ++to_pow[tmp];
    }
    int winnings = 0;
    for (int i = 0; i < m; ++i) {
        int c,t;
        cin >> c;
        for (int j = 0; j < c; ++j) {
            cin >> t;
            auto end = --to_pow.end();
            if (to_pow.size() == 0 || end->first <= t) {
                cout << winnings + 1 << "\n";
                return 0;
            }
            // auto used_card = upper_bound(to_pow.begin() + new_beg, to_pow.end(), t);
            auto used_card = to_pow.upper_bound(t);
            if (used_card == to_pow.end()) {
                // to_pow.erase(to_pow.begin());
                to_pow.begin()->second--;
                if (to_pow.begin()->second == 0) {
                    to_pow.erase(to_pow.begin());
                }
            } else {
                // to_pow.erase(used_card);
                used_card->second--;
                if (used_card->second == 0) {
                    to_pow.erase(used_card);
                }
            }
        }
        ++winnings;
    }
    cout << winnings + 1 << "\n";
}